

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O3

bool CoreML::Specification::GLMClassifier_PostEvaluationTransform_IsValid(int value)

{
  return (uint)value < 2;
}

Assistant:

bool GLMClassifier_PostEvaluationTransform_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}